

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upstream_keepalive_module.c
# Opt level: O1

void ngx_http_upstream_free_keepalive_peer(ngx_peer_connection_t *pc,void *data,ngx_uint_t state)

{
  uint uVar1;
  ngx_connection_t *pnVar2;
  long lVar3;
  long *plVar4;
  ngx_connection_t *c;
  undefined8 *puVar5;
  ngx_event_t *pnVar6;
  ngx_event_t *pnVar7;
  ngx_cycle_t *pnVar8;
  ngx_int_t nVar9;
  long *plVar10;
  
  if ((pc->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,pc->log,0,"free keepalive peer");
  }
  pnVar2 = pc->connection;
  if ((((pnVar2 != (ngx_connection_t *)0x0 && (char)(((uint)state & 4) >> 2) == '\0') &&
       ((pnVar2->read->field_0x9 & 7) == 0)) && ((pnVar2->write->field_0x9 & 6) == 0)) &&
     ((((~*(uint *)(*(long *)((long)data + 8) + 1000) & 0x900) == 0 && (ngx_terminate == 0)) &&
      (ngx_exiting == 0)))) {
    nVar9 = ngx_handle_read_event(pnVar2->read,0);
    if (nVar9 == 0) {
      if ((pc->log->log_level & 0x100) != 0) {
        ngx_log_error_core(8,pc->log,0,"free keepalive peer: saving connection %p",pnVar2);
      }
      lVar3 = *data;
      if (lVar3 + 0x18 == *(long *)(lVar3 + 0x18)) {
        plVar10 = *(long **)(lVar3 + 8);
        plVar4 = (long *)plVar10[1];
        *plVar4 = *plVar10;
        *(long **)(*plVar10 + 8) = plVar4;
        *plVar10 = 0;
        plVar10[1] = 0;
        c = (ngx_connection_t *)plVar10[2];
        ngx_destroy_pool(c->pool);
        ngx_close_connection(c);
      }
      else {
        plVar10 = *(long **)(lVar3 + 0x20);
        plVar4 = (long *)plVar10[1];
        *plVar4 = *plVar10;
        *(long **)(*plVar10 + 8) = plVar4;
        *plVar10 = 0;
        plVar10[1] = 0;
      }
      lVar3 = *data;
      puVar5 = *(undefined8 **)(lVar3 + 0x10);
      plVar10[1] = (long)puVar5;
      *puVar5 = plVar10;
      *plVar10 = lVar3 + 8;
      *(long **)(lVar3 + 0x10) = plVar10;
      plVar10[2] = (long)pnVar2;
      pc->connection = (ngx_connection_t *)0x0;
      if ((pnVar2->read->field_0x9 & 8) != 0) {
        ngx_event_del_timer(pnVar2->read);
      }
      if ((pnVar2->write->field_0x9 & 8) != 0) {
        ngx_event_del_timer(pnVar2->write);
      }
      pnVar6 = pnVar2->write;
      pnVar6->handler = ngx_http_upstream_keepalive_dummy_handler;
      pnVar7 = pnVar2->read;
      pnVar7->handler = ngx_http_upstream_keepalive_close_handler;
      pnVar2->data = plVar10 + -1;
      pnVar2->field_0xd9 = pnVar2->field_0xd9 | 0x40;
      pnVar8 = ngx_cycle;
      pnVar2->log = ngx_cycle->log;
      pnVar7->log = pnVar8->log;
      pnVar6->log = pnVar8->log;
      pnVar2->pool->log = pnVar8->log;
      uVar1 = pc->socklen;
      *(uint *)(plVar10 + 3) = uVar1;
      memcpy((void *)((long)plVar10 + 0x1c),pc->sockaddr,(ulong)uVar1);
      if ((pnVar2->read->field_0x8 & 0x20) != 0) {
        ngx_http_upstream_keepalive_close_handler(pnVar2->read);
      }
    }
  }
  (**(code **)((long)data + 0x20))(pc,*(undefined8 *)((long)data + 0x10),state);
  return;
}

Assistant:

static void
ngx_http_upstream_free_keepalive_peer(ngx_peer_connection_t *pc, void *data,
    ngx_uint_t state)
{
    ngx_http_upstream_keepalive_peer_data_t  *kp = data;
    ngx_http_upstream_keepalive_cache_t      *item;

    ngx_queue_t          *q;
    ngx_connection_t     *c;
    ngx_http_upstream_t  *u;

    ngx_log_debug0(NGX_LOG_DEBUG_HTTP, pc->log, 0,
                   "free keepalive peer");

    /* cache valid connections */

    u = kp->upstream;
    c = pc->connection;

    if (state & NGX_PEER_FAILED
        || c == NULL
        || c->read->eof
        || c->read->error
        || c->read->timedout
        || c->write->error
        || c->write->timedout)
    {
        goto invalid;
    }

    if (!u->keepalive) {
        goto invalid;
    }

    if (!u->request_body_sent) {
        goto invalid;
    }

    if (ngx_terminate || ngx_exiting) {
        goto invalid;
    }

    if (ngx_handle_read_event(c->read, 0) != NGX_OK) {
        goto invalid;
    }

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, pc->log, 0,
                   "free keepalive peer: saving connection %p", c);

    if (ngx_queue_empty(&kp->conf->free)) {

        q = ngx_queue_last(&kp->conf->cache);
        ngx_queue_remove(q);

        item = ngx_queue_data(q, ngx_http_upstream_keepalive_cache_t, queue);

        ngx_http_upstream_keepalive_close(item->connection);

    } else {
        q = ngx_queue_head(&kp->conf->free);
        ngx_queue_remove(q);

        item = ngx_queue_data(q, ngx_http_upstream_keepalive_cache_t, queue);
    }

    ngx_queue_insert_head(&kp->conf->cache, q);

    item->connection = c;

    pc->connection = NULL;

    if (c->read->timer_set) {
        ngx_del_timer(c->read);
    }
    if (c->write->timer_set) {
        ngx_del_timer(c->write);
    }

    c->write->handler = ngx_http_upstream_keepalive_dummy_handler;
    c->read->handler = ngx_http_upstream_keepalive_close_handler;

    c->data = item;
    c->idle = 1;
    c->log = ngx_cycle->log;
    c->read->log = ngx_cycle->log;
    c->write->log = ngx_cycle->log;
    c->pool->log = ngx_cycle->log;

    item->socklen = pc->socklen;
    ngx_memcpy(&item->sockaddr, pc->sockaddr, pc->socklen);

    if (c->read->ready) {
        ngx_http_upstream_keepalive_close_handler(c->read);
    }

invalid:

    kp->original_free_peer(pc, kp->data, state);
}